

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitTestCaseData::add
          (JUnitTestCaseData *this,string *classname,string *name)

{
  pointer *ppJVar1;
  pointer __first;
  ulong uVar2;
  ulong uVar3;
  pointer __result;
  pointer pJVar4;
  pointer pJVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  ulong uVar6;
  
  pJVar5 = (this->testcases).
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pJVar5 == (this->testcases).
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->testcases).
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pJVar5 - (long)__first == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = ((long)pJVar5 - (long)__first) / 0x78;
    uVar3 = 1;
    if (pJVar5 != __first) {
      uVar3 = uVar2;
    }
    uVar6 = uVar3 + uVar2;
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x111111111111111;
    if (0x111111111111110 < uVar6) {
      uVar6 = 0x111111111111111;
    }
    if (CARRY8(uVar3,uVar2)) {
      uVar6 = 0x111111111111111;
    }
    if (uVar6 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar6 * 0x78);
    }
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)(__result + uVar2),(JUnitTestCase *)classname,name,__args_1);
    pJVar4 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ::_S_relocate(__first,pJVar5,__result,(_Tp_alloc_type *)__args_1);
    pJVar5 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ::_S_relocate(pJVar5,pJVar5,pJVar4 + 1,(_Tp_alloc_type *)__args_1);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pJVar5;
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar6;
  }
  else {
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)pJVar5,(JUnitTestCase *)classname,name,in_RCX);
    ppJVar1 = &(this->testcases).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppJVar1 = *ppJVar1 + 1;
  }
  return;
}

Assistant:

void add(const std::string& classname, const std::string& name) {
                testcases.emplace_back(classname, name);
            }